

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanio.c
# Opt level: O2

void Abc_ObjRemoveFanins(Abc_Obj_t *pObj)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(uint)(pObj->vFanins).nSize;
  while( true ) {
    if ((int)uVar3 < 1) {
      pObj->field_0x15 = pObj->field_0x15 & 0xf3;
      if ((pObj->vFanins).nSize == 0) {
        return;
      }
      __assert_fail("vFaninsOld->nSize == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                    ,0x9b,"void Abc_ObjRemoveFanins(Abc_Obj_t *)");
    }
    iVar1 = (pObj->vFanins).pArray[uVar3 - 1];
    if (((long)iVar1 < 0) || (pVVar2 = pObj->pNtk->vObjs, pVVar2->nSize <= iVar1)) break;
    Abc_ObjDeleteFanin(pObj,(Abc_Obj_t *)pVVar2->pArray[iVar1]);
    uVar3 = uVar3 - 1;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Abc_ObjRemoveFanins( Abc_Obj_t * pObj )
{
    Vec_Int_t * vFaninsOld;
    Abc_Obj_t * pFanin;
    int k;
    // remove old fanins
    vFaninsOld = &pObj->vFanins;
    for ( k = vFaninsOld->nSize - 1; k >= 0; k-- )
    {
        pFanin = Abc_NtkObj( pObj->pNtk, vFaninsOld->pArray[k] );
        Abc_ObjDeleteFanin( pObj, pFanin );
    }
    pObj->fCompl0 = 0;
    pObj->fCompl1 = 0;
    assert( vFaninsOld->nSize == 0 );
}